

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

bool __thiscall File::unlock(File *this)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined1 uVar4;
  undefined4 local_28 [2];
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  if (this->valid == true) {
    fflush((FILE *)this->stream);
  }
  local_28[0] = 2;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  if ((this->locked == true) && (this->valid == true)) {
    iVar1 = fileno((FILE *)this->stream);
    iVar1 = fcntl(iVar1,6,local_28);
    if (iVar1 == 0) {
      this->locked = false;
      uVar4 = this->valid;
    }
    else {
      this->valid = false;
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      uVar4 = 0;
      softHSMLog(3,"unlock",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/File.cpp"
                 ,0x2d9,"Could not unlock the file: %s",pcVar3);
    }
  }
  else {
    uVar4 = 0;
  }
  return (bool)uVar4;
}

Assistant:

bool File::unlock()
{
	flush();

#ifndef _WIN32
	struct flock fl;
	fl.l_type = F_UNLCK;
	fl.l_whence = SEEK_SET;
	fl.l_start = 0;
	fl.l_len = 0;
	fl.l_pid = 0;

	if (!locked || !valid) return false;

	if (fcntl(fileno(stream), F_SETLK, &fl) != 0)
	{
		valid = false;

		ERROR_MSG("Could not unlock the file: %s", strerror(errno));
		return false;
	}
#else
	HANDLE hFile;
	OVERLAPPED o;

	if (!locked || !valid) return false;

	hFile = (HANDLE) _get_osfhandle(_fileno(stream));
	if (hFile == INVALID_HANDLE_VALUE)
	{
		ERROR_MSG("Invalid handle");
		return false;
	}

	memset(&o, 0, sizeof(o));
	if (!UnlockFileEx(hFile, 0, 1, 0, &o))
	{
		DWORD rv = GetLastError();

		valid = false;

		ERROR_MSG("Could not unlock the file: 0x%08x", rv);
		return  false;
	}
#endif
			

	locked = false;

	return valid;
}